

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O2

FilterPropagateResult __thiscall
duckdb::StringStats::CheckZonemap
          (StringStats *this,BaseStatistics *stats,ExpressionType comparison_type,
          array_ptr<duckdb::Value,_true> constants)

{
  FilterPropagateResult FVar1;
  Value *value;
  string *constant;
  Value *pVVar2;
  undefined7 in_register_00000011;
  array_ptr_iterator<duckdb::Value> __begin1;
  
  pVVar2 = constants.ptr;
  __begin1.index = 0;
  __begin1.ptr = (Value *)CONCAT71(in_register_00000011,comparison_type);
  __begin1.size = (idx_t)pVVar2;
  while( true ) {
    if ((Value *)__begin1.size == pVVar2 &&
        ((Value *)__begin1.index == pVVar2 &&
        __begin1.ptr == (Value *)CONCAT71(in_register_00000011,comparison_type))) {
      return FILTER_ALWAYS_FALSE;
    }
    value = array_ptr_iterator<duckdb::Value>::operator*(&__begin1);
    constant = StringValue::Get_abi_cxx11_(value);
    FVar1 = CheckZonemap((const_data_ptr_t)(this + 0x28),8,(const_data_ptr_t)(this + 0x30),8,
                         (ExpressionType)stats,constant);
    if (FVar1 < FILTER_ALWAYS_FALSE) break;
    __begin1.index = __begin1.index + 1;
    if (__begin1.size <= __begin1.index) {
      __begin1.index = __begin1.size;
    }
  }
  return FVar1;
}

Assistant:

FilterPropagateResult StringStats::CheckZonemap(const BaseStatistics &stats, ExpressionType comparison_type,
                                                array_ptr<Value> constants) {
	auto &string_data = StringStats::GetDataUnsafe(stats);
	for (auto &constant_value : constants) {
		D_ASSERT(constant_value.type() == stats.GetType());
		D_ASSERT(!constant_value.IsNull());
		auto &constant = StringValue::Get(constant_value);
		auto prune_result = CheckZonemap(string_data.min, StringStatsData::MAX_STRING_MINMAX_SIZE, string_data.max,
		                                 StringStatsData::MAX_STRING_MINMAX_SIZE, comparison_type, constant);
		if (prune_result == FilterPropagateResult::NO_PRUNING_POSSIBLE) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else if (prune_result == FilterPropagateResult::FILTER_ALWAYS_TRUE) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		}
	}
	return FilterPropagateResult::FILTER_ALWAYS_FALSE;
}